

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniserver.c
# Opt level: O2

void handle_request(void *args)

{
  uint sockfd;
  size_t sVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  http_header_t *phVar5;
  size_t sVar6;
  char *pcVar7;
  MiniServerCallback p_Var8;
  size_t sVar9;
  void *pvVar10;
  char *pcVar11;
  int local_564;
  MiniServerCallback local_560;
  WebCallback_HostValidate local_558;
  int timeout;
  int local_548;
  socklen_t addr_len;
  memptr header;
  SOCKINFO info;
  char host_port [256];
  membuffer redir_buf;
  char redir_str [256];
  http_parser_t parser;
  
  timeout = 0x1e;
  sockfd = *args;
  UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x195,
             "miniserver %d: READING\n",(ulong)sockfd);
  iVar3 = sock_init_with_ip(&info,sockfd,(sockaddr *)((long)args + 8));
  if (iVar3 != 0) {
    free(args);
    httpmsg_destroy(&parser.msg);
    return;
  }
  iVar3 = http_RecvMessage(&info,&parser,HTTPMETHOD_UNKNOWN,&timeout,&local_564);
  if (iVar3 != 0) goto LAB_0010ac42;
  UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x1aa,
             "miniserver %d: PROCESSING...\n",(ulong)sockfd);
  p_Var8 = gGetCallback;
  pvVar10 = gWebCallback_HostValidateCookie;
  local_564 = 500;
  if (HTTPMETHOD_SIMPLEGET < parser.msg.method) goto LAB_0010ac42;
  if ((0x101cU >> (parser.msg.method & 0x1f) & 1) == 0) {
    if ((0x1c0U >> (parser.msg.method & 0x1f) & 1) == 0) {
      if ((0x820U >> (parser.msg.method & 0x1f) & 1) == 0) goto LAB_0010ac42;
      pcVar7 = "miniserver %d: got SOAP msg\n";
      iVar3 = 0xfe;
      p_Var8 = gSoapCallback;
    }
    else {
      pcVar7 = "miniserver %d: got GENA msg\n";
      iVar3 = 0x10a;
      p_Var8 = gGenaCallback;
    }
    local_558 = (WebCallback_HostValidate)0x0;
    UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",iVar3,pcVar7,
               (ulong)(uint)info.socket);
    pvVar10 = (void *)0x0;
  }
  else {
    local_558 = gWebCallback_HostValidate;
    UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x119,
               "miniserver %d: got WEB server msg\n",(ulong)(uint)info.socket);
  }
  if (p_Var8 == (MiniServerCallback)0x0) goto LAB_0010ac42;
  phVar5 = httpmsg_find_hdr(&parser.msg,7,&header);
  local_564 = -0x77;
  if (phVar5 == (http_header_t *)0x0) goto LAB_0010ac42;
  sVar6 = 0xff;
  if (header.length < 0xff) {
    sVar6 = header.length;
  }
  pcVar7 = host_port;
  local_560 = p_Var8;
  memcpy(pcVar7,header.buf,sVar6);
  host_port[sVar6] = '\0';
  if (local_558 == (WebCallback_HostValidate)0x0) {
    sVar1 = sVar6;
    do {
      sVar9 = sVar1;
      cVar2 = host_port[0];
      if (sVar9 == 1) goto LAB_0010abf3;
      cVar2 = info.foreign_sockaddr.__ss_padding[sVar9 + 0x7d];
    } while ((cVar2 != ':') && (sVar1 = sVar9 - 1, cVar2 != ']'));
    pcVar7 = info.foreign_sockaddr.__ss_padding + sVar9 + 0x7d;
LAB_0010abf3:
    pcVar11 = host_port + sVar6;
    if (cVar2 == ':') {
      *pcVar7 = '\0';
      pcVar11 = pcVar7;
    }
    iVar3 = inet_pton(2,host_port,redir_str);
    if (iVar3 != 1) {
      sVar6 = strlen(host_port);
      p_Var8 = local_560;
      if (((2 < sVar6) && (host_port[0] == '[')) && (pcVar11[-1] == ']')) {
        pcVar11[-1] = '\0';
        iVar4 = inet_pton(10,host_port + 1,redir_str);
        iVar3 = 0;
        if (iVar4 == 1) goto LAB_0010ac28;
      }
      if (gAllowLiteralHostRedirection == 0) {
        UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x143,
                   "Possible DNS Rebind attack prevented.\n");
        goto LAB_0010ac42;
      }
      local_548 = 0x1e;
      addr_len = 0x80;
      iVar3 = getsockname(info.socket,(sockaddr *)&redir_buf,&addr_len);
      if (iVar3 == 0) {
        if ((short)redir_buf.buf == 10) {
          pcVar7 = inet_ntop(10,&redir_buf.length,redir_str,0x100);
          if (pcVar7 != (char *)0x0) {
            pcVar7 = "[%s]:%d";
LAB_0010adca:
            snprintf(host_port,0x100,pcVar7,redir_str,
                     (ulong)(ushort)(redir_buf.buf._2_2_ << 8 | redir_buf.buf._2_2_ >> 8));
          }
        }
        else {
          pcVar7 = inet_ntop(2,(void *)((long)&redir_buf.buf + 4),redir_str,0x100);
          if (pcVar7 != (char *)0x0) {
            pcVar7 = "%s:%d";
            goto LAB_0010adca;
          }
        }
      }
      membuffer_init(&redir_buf);
      snprintf(redir_str,0x100,"HTTP/1.1 307 Temporary Redirect\r\nLocation: http://%s\r\n\r\n",
               host_port);
      membuffer_append_str(&redir_buf,redir_str);
      iVar3 = http_SendMessage(&info,&local_548,"b",
                               CONCAT44(redir_buf.buf._4_4_,
                                        CONCAT22(redir_buf.buf._2_2_,(short)redir_buf.buf)),
                               redir_buf.length);
      membuffer_destroy(&redir_buf);
      local_564 = iVar3;
      goto LAB_0010ac42;
    }
    iVar3 = 0;
    p_Var8 = local_560;
  }
  else {
    iVar3 = (*local_558)(host_port,pvVar10);
    p_Var8 = local_560;
    if (iVar3 == -0x77) goto LAB_0010ac42;
  }
LAB_0010ac28:
  (*p_Var8)(&parser,&parser.msg,&info);
  local_564 = iVar3;
LAB_0010ac42:
  if (0 < local_564) {
    http_SendStatusResponse(&info,local_564,parser.msg.major_version,parser.msg.minor_version);
  }
  sock_destroy(&info,2);
  httpmsg_destroy(&parser.msg);
  free(args);
  UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x1c3,
             "miniserver %d: COMPLETE\n",(ulong)sockfd);
  return;
}

Assistant:

static void handle_request(
	/*! [in] Request Message to be handled. */
	void *args)
{
	SOCKINFO info;
	int http_error_code;
	int ret_code;
	int major = 1;
	int minor = 1;
	http_parser_t parser;
	http_message_t *hmsg = NULL;
	int timeout = HTTP_DEFAULT_TIMEOUT;
	struct mserv_request_t *request = (struct mserv_request_t *)args;
	SOCKET connfd = request->connfd;

	UpnpPrintf(UPNP_INFO,
		MSERV,
		__FILE__,
		__LINE__,
		"miniserver %d: READING\n",
		connfd);
	/* parser_request_init( &parser ); */ /* LEAK_FIX_MK */
	hmsg = &parser.msg;
	ret_code = sock_init_with_ip(
		&info, connfd, (struct sockaddr *)&request->foreign_sockaddr);
	if (ret_code != UPNP_E_SUCCESS) {
		free(request);
		httpmsg_destroy(hmsg);
		return;
	}
	/* read */
	ret_code = http_RecvMessage(
		&info, &parser, HTTPMETHOD_UNKNOWN, &timeout, &http_error_code);
	if (ret_code != 0) {
		goto error_handler;
	}
	UpnpPrintf(UPNP_INFO,
		MSERV,
		__FILE__,
		__LINE__,
		"miniserver %d: PROCESSING...\n",
		connfd);
	/* dispatch */
	http_error_code = dispatch_request(&info, &parser);
	if (http_error_code != 0) {
		goto error_handler;
	}
	http_error_code = 0;

error_handler:
	if (http_error_code > 0) {
		if (hmsg) {
			major = hmsg->major_version;
			minor = hmsg->minor_version;
		}
		handle_error(&info, http_error_code, major, minor);
	}
	sock_destroy(&info, SD_BOTH);
	httpmsg_destroy(hmsg);
	free(request);

	UpnpPrintf(UPNP_INFO,
		MSERV,
		__FILE__,
		__LINE__,
		"miniserver %d: COMPLETE\n",
		connfd);
}